

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void __thiscall CVmObjGramProd::mark_alt_refs(CVmObjGramProd *this,vmgram_alt_info *alt,uint state)

{
  long in_RSI;
  size_t j;
  vmgram_tok_info *tok;
  undefined8 in_stack_ffffffffffffffd8;
  ulong uVar1;
  CVmObjTable *in_stack_ffffffffffffffe0;
  CVmObjTable *this_00;
  
  if (*(int *)(in_RSI + 0xc) != 0) {
    CVmObjTable::mark_all_refs
              (in_stack_ffffffffffffffe0,(vm_obj_id_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
               (uint)in_stack_ffffffffffffffd8);
  }
  this_00 = *(CVmObjTable **)(in_RSI + 0x10);
  for (uVar1 = 0; uVar1 < *(ulong *)(in_RSI + 0x18); uVar1 = uVar1 + 1) {
    if ((*(char *)((long)&this_00->post_load_init_table_ + 2) == '\x01') &&
       (*(int *)&this_00->globals_ != 0)) {
      CVmObjTable::mark_all_refs(this_00,(vm_obj_id_t)(uVar1 >> 0x20),(uint)uVar1);
    }
    this_00 = (CVmObjTable *)&this_00->page_slots_;
  }
  return;
}

Assistant:

void CVmObjGramProd::mark_alt_refs(VMG_ const vmgram_alt_info *alt, uint state)
{
    /* mark the match object */
    if (alt->proc_obj != VM_INVALID_OBJ)
        G_obj_table->mark_all_refs(alt->proc_obj, state);

    /* run through the token list */
    vmgram_tok_info *tok = alt->toks;
    for (size_t j = 0 ; j < alt->tok_cnt ; ++j, ++tok)
    {
        /* only production matches have object references */
        if (tok->typ == VMGRAM_MATCH_PROD
            && tok->typinfo.prod_obj != VM_INVALID_OBJ)
        {
            /* mark the reference */
            G_obj_table->mark_all_refs(tok->typinfo.prod_obj, state);
        }
    }
}